

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O0

void __thiscall Iir::Biquad::setOnePole(Biquad *this,complex_t pole,complex_t zero)

{
  double in_RDI;
  double dVar1;
  double dVar2;
  double b2;
  double b1;
  double b0;
  double a2;
  double a1;
  double a0;
  char *in_stack_ffffffffffffffb0;
  double a2_00;
  double a1_00;
  Biquad *this_00;
  complex<double> local_20;
  complex<double> local_10;
  
  dVar1 = std::complex<double>::imag_abi_cxx11_(&local_10);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    throw_invalid_argument(in_stack_ffffffffffffffb0);
  }
  dVar1 = std::complex<double>::imag_abi_cxx11_(&local_20);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    throw_invalid_argument(in_stack_ffffffffffffffb0);
  }
  this_00 = (Biquad *)0x3ff0000000000000;
  dVar1 = std::complex<double>::real_abi_cxx11_(&local_10);
  dVar1 = -dVar1;
  a1_00 = 0.0;
  a2_00 = 1.0;
  dVar2 = std::complex<double>::real_abi_cxx11_(&local_20);
  setCoefficients(this_00,dVar1,a1_00,a2_00,-dVar2,0.0,in_RDI);
  return;
}

Assistant:

void Biquad::setOnePole (complex_t pole, complex_t zero)
	{
		if (pole.imag() != 0) throw_invalid_argument("Imaginary part of pole is non-zero.");
		if (zero.imag() != 0) throw_invalid_argument("Imaginary part of zero is non-zero.");

		const double a0 = 1;
		const double a1 = -pole.real();
		const double a2 = 0;
		const double b0 = 1;
		const double b1 = -zero.real();
		const double b2 = 0;

		setCoefficients (a0, a1, a2, b0, b1, b2);
	}